

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

TX_SIZE av1_get_adjusted_tx_size(TX_SIZE tx_size)

{
  TX_SIZE tx_size_local;
  TX_SIZE local_1;
  
  switch(tx_size) {
  case '\x04':
  case '\v':
  case '\f':
    local_1 = '\x03';
    break;
  default:
    local_1 = tx_size;
    break;
  case '\x11':
    local_1 = '\t';
    break;
  case '\x12':
    local_1 = '\n';
  }
  return local_1;
}

Assistant:

static inline TX_SIZE av1_get_adjusted_tx_size(TX_SIZE tx_size) {
  switch (tx_size) {
    case TX_64X64:
    case TX_64X32:
    case TX_32X64: return TX_32X32;
    case TX_64X16: return TX_32X16;
    case TX_16X64: return TX_16X32;
    default: return tx_size;
  }
}